

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O0

char * bufread_simple_label(shared_data *sd,label_data *ld,char *c)

{
  float *in_RDX;
  float *in_RSI;
  shared_data *in_RDI;
  
  *in_RSI = *in_RDX;
  in_RSI[1] = in_RDX[1];
  in_RSI[2] = in_RDX[2];
  count_label(in_RDI,*in_RSI);
  return (char *)(in_RDX + 3);
}

Assistant:

char* bufread_simple_label(shared_data* sd, label_data* ld, char* c)
{
  memcpy(&ld->label, c, sizeof(ld->label));
  //  cout << ld->label << " " << sd->is_more_than_two_labels_observed << " " << sd->first_observed_label <<  endl;
  c += sizeof(ld->label);
  memcpy(&ld->weight, c, sizeof(ld->weight));
  c += sizeof(ld->weight);
  memcpy(&ld->initial, c, sizeof(ld->initial));
  c += sizeof(ld->initial);

  count_label(sd, ld->label);
  return c;
}